

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O2

void TestPUMADP_histOptions(Arguments *args)

{
  ostream *poVar1;
  PlanningUnitMADPDiscreteParameters params;
  undefined8 local_8d8 [2];
  undefined8 local_8c8 [2];
  ProblemDecTiger pdt;
  TestPU pu;
  TestPU pu_all;
  
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(&params);
  poVar1 = std::operator<<((ostream *)&std::cout,"TestPUMADP_histOptions ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"---------------------- ");
  std::endl<char,std::char_traits<char>>(poVar1);
  ProblemDecTiger::ProblemDecTiger(&pdt);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&params,0));
  local_8c8[0] = _params;
  TestPU::TestPU(&pu_all,(PlanningUnitMADPDiscreteParameters *)local_8c8,3,
                 (MultiAgentDecisionProcessDiscrete *)&pdt);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)local_8c8);
  poVar1 = std::operator<<((ostream *)&std::cout,"->Planning Unit with everything generated");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-----------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  PlanningUnitMADPDiscrete::Print();
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&params,0));
  local_8d8[0] = _params;
  TestPU::TestPU(&pu,(PlanningUnitMADPDiscreteParameters *)local_8d8,3,
                 (MultiAgentDecisionProcessDiscrete *)&pdt);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)local_8d8);
  poVar1 = std::operator<<((ostream *)&std::cout,"->Planning Unit with nothing generated");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  PlanningUnitMADPDiscrete::Print();
  poVar1 = std::operator<<((ostream *)&std::cout,"TestPUMADP_histOptions ended ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (args->testMode == false) {
    poVar1 = std::operator<<((ostream *)&std::cout,"press <enter> to continue...");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::istream::get();
  }
  PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete(&pu.super_PlanningUnitMADPDiscrete);
  PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete(&pu_all.super_PlanningUnitMADPDiscrete);
  ProblemDecTiger::~ProblemDecTiger(&pdt);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(&params);
  return;
}

Assistant:

void  TestPUMADP_histOptions(const ArgumentHandlers::Arguments& args)
{
    int h = 3;
    PlanningUnitMADPDiscreteParameters params;

    cout << "TestPUMADP_histOptions "<<endl;
    cout << "---------------------- "<<endl;
    ProblemDecTiger pdt;
   params.SetComputeAll(true);
    TestPU pu_all (params, h, &pdt);
    cout << "->Planning Unit with everything generated"<< endl;
    cout << "-----------------------------------------"<< endl;
    pu_all.Print();

    params.SetComputeAll(false);
    TestPU pu (params, h, &pdt);
    cout << "->Planning Unit with nothing generated"<< endl;
    cout << "--------------------------------------"<< endl;
    pu.Print();
    cout << "TestPUMADP_histOptions ended "<<endl<<endl<<endl<<endl<<endl;

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
}